

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ** __thiscall ImGuiStorage::GetVoidPtrRef(ImGuiStorage *this,ImGuiID key,void *default_val)

{
  ImVector<ImGuiStorage::ImGuiStoragePair> *pIVar1;
  ImVector<ImGuiStorage::ImGuiStoragePair> *pIVar2;
  ImVector<ImGuiStorage::ImGuiStoragePair> *this_00;
  void *in_RDX;
  ImGuiID in_ESI;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_RDI;
  ImGuiStoragePair *it;
  ImGuiStoragePair *in_stack_ffffffffffffffd0;
  anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 in_stack_ffffffffffffffd8;
  
  pIVar1 = (ImVector<ImGuiStorage::ImGuiStoragePair> *)LowerBound(in_RDI,in_ESI);
  this_00 = pIVar1;
  pIVar2 = (ImVector<ImGuiStorage::ImGuiStoragePair> *)
           ImVector<ImGuiStorage::ImGuiStoragePair>::end(in_RDI);
  if ((pIVar1 == pIVar2) || (this_00->Size != in_ESI)) {
    ImGuiStoragePair::ImGuiStoragePair((ImGuiStoragePair *)&stack0xffffffffffffffd0,in_ESI,in_RDX);
    this_00 = (ImVector<ImGuiStorage::ImGuiStoragePair> *)
              ImVector<ImGuiStorage::ImGuiStoragePair>::insert
                        (this_00,(ImGuiStoragePair *)in_stack_ffffffffffffffd8.val_p,
                         in_stack_ffffffffffffffd0);
  }
  return (void **)&this_00->Data;
}

Assistant:

void** ImGuiStorage::GetVoidPtrRef(ImGuiID key, void* default_val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, ImGuiStoragePair(key, default_val));
    return &it->val_p;
}